

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O0

void __thiscall EDColor::extractNewSegments(EDColor *this)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference __last;
  allocator<cv::Point_<int>_> local_91;
  undefined1 local_90 [8];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> subVec;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_68;
  int local_4c;
  int local_48;
  int len;
  int c_1;
  int r_1;
  int end;
  int c;
  int r;
  int start;
  int i;
  int noSegments;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  validSegments;
  EDColor *this_local;
  
  validSegments.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)&i);
  start = 0;
  r = 0;
  do {
    uVar2 = (ulong)r;
    sVar3 = std::
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ::size(&this->segments);
    if (sVar3 <= uVar2) {
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::operator=(&this->segments,
                  (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&i);
      this->segmentNo = start;
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 *)&i);
      return;
    }
    c = 0;
    while( true ) {
      uVar2 = (ulong)c;
      pvVar4 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[](&this->segments,(long)r);
      sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar4);
      if (sVar3 <= uVar2) break;
      while( true ) {
        uVar2 = (ulong)c;
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segments,(long)r);
        sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar4);
        iVar1 = c;
        if (sVar3 <= uVar2) break;
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segments,(long)r);
        pvVar5 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                           (pvVar4,(long)c);
        end = pvVar5->y;
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segments,(long)r);
        pvVar5 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                           (pvVar4,(long)c);
        r_1 = pvVar5->x;
        iVar1 = c;
        if (this->edgeImg[end * this->width + r_1] != '\0') break;
        c = c + 1;
      }
      do {
        c_1 = iVar1 + 1;
        uVar2 = (ulong)c_1;
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segments,(long)r);
        sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar4);
        if (sVar3 <= uVar2) break;
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segments,(long)r);
        pvVar5 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                           (pvVar4,(long)c_1);
        len = pvVar5->y;
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segments,(long)r);
        pvVar5 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                           (pvVar4,(long)c_1);
        local_48 = pvVar5->x;
        iVar1 = c_1;
      } while (this->edgeImg[len * this->width + local_48] != '\0');
      local_4c = c_1 - c;
      if (9 < local_4c) {
        local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_68);
        std::
        vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ::push_back((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     *)&i,&local_68);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector(&local_68);
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segments,(long)r);
        pvVar5 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                           (pvVar4,(long)c);
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segments,(long)r);
        __last = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                           (pvVar4,(long)(c_1 + -1));
        std::allocator<cv::Point_<int>_>::allocator(&local_91);
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::vector<cv::Point_<int>*,void>
                  ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)local_90,pvVar5,__last
                   ,&local_91);
        std::allocator<cv::Point_<int>_>::~allocator(&local_91);
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               *)&i,(long)start);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
                  (pvVar4,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_90);
        start = start + 1;
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_90);
      }
      c = c_1 + 1;
    }
    r = r + 1;
  } while( true );
}

Assistant:

void EDColor::extractNewSegments()
{
	vector< vector<Point> > validSegments;
	int noSegments = 0;

	for (int i = 0; i < segments.size(); i++) {
		int start = 0;
		while (start < segments[i].size()) {

			while (start < segments[i].size()) {
				int r = segments[i][start].y;
				int c = segments[i][start].x;

				if (edgeImg[r*width + c]) break;
				start++;
			} //end-while

			int end = start + 1;
			while (end < segments[i].size()) {
				int r = segments[i][end].y;
				int c = segments[i][end].x;

				if (edgeImg[r*width + c] == 0) break;
				end++;
			} //end-while

			int len = end - start;
			if (len >= 10) {
				// A new segment. Accepted only only long enough (whatever that means)
				//segments[noSegments].pixels = &map->segments[i].pixels[start];
				//segments[noSegments].noPixels = len;
				validSegments.push_back(vector<Point>());
				vector<Point> subVec(&segments[i][start], &segments[i][end - 1]);
				validSegments[noSegments] = subVec;
				noSegments++;
			} //end-else

			start = end + 1;
		} //end-while
	} //end-for

	// Update
	segments = validSegments;
	segmentNo = noSegments; // = validSegments.size()

}